

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  string *configPath;
  InputParser parser;
  Config config;
  allocator<char> local_15d;
  int local_15c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  string local_140;
  Config local_120;
  
  local_15c = argc;
  InputParser::InputParser((InputParser *)&local_158,&local_15c,argv);
  Angelsen::Config::Config(&local_120);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"-config",&local_15d);
  configPath = InputParser::getCmdOption((InputParser *)&local_158,&local_140);
  Angelsen::Config::updateFromJson(&local_120,configPath);
  std::__cxx11::string::~string((string *)&local_140);
  Angelsen::Config::loadTemplate(&local_120);
  Angelsen::runServer(&local_120);
  Angelsen::Config::~Config(&local_120);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_158);
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
    InputParser parser(argc, argv);

    Angelsen::Config config;
    config.updateFromJson(parser.getCmdOption("-config"));
    config.loadTemplate();

    Angelsen::runServer(config);
}